

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

bool __thiscall Game::teamMembers(Game *this,size_t player1,size_t player2)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  bool bVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  size_t local_18;
  
  bVar2 = true;
  if (player1 != player2) {
    getTeamMember(&local_30,this,player1);
    local_18 = player2;
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                      (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    bVar2 = _Var1._M_current !=
            local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar2;
}

Assistant:

bool Game::teamMembers(size_t player1, size_t player2) {
    return player1 == player2 || contains(getTeamMember(player1), player2);
}